

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue::~IfcPropertyEnumeratedValue
          (IfcPropertyEnumeratedValue *this)

{
  undefined1 *puVar1;
  
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcPropertyEnumeratedValue_0088b1b0;
  *(undefined ***)&this->field_0x38 = &PTR__IfcPropertyEnumeratedValue_0088b228;
  *(undefined ***)&this[-1].field_0xa8 = &PTR__IfcPropertyEnumeratedValue_0088b1d8;
  *(undefined ***)this = &PTR__IfcPropertyEnumeratedValue_0088b200;
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&this->field_0x10);
  *(undefined8 *)&this[-1].field_0x50 = 0x88b340;
  *(undefined8 *)&this->field_0x38 = 0x88b368;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>.
             field_0x18;
  if ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_> *)puVar1 !=
      &this[-1].EnumerationReference) {
    operator_delete(puVar1);
  }
  if ((bitset<2UL> *)*(undefined1 **)&this[-1].field_0x60 !=
      &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>.
       aux_is_derived) {
    operator_delete(*(undefined1 **)&this[-1].field_0x60);
  }
  operator_delete(&this[-1].field_0x50);
  return;
}

Assistant:

IfcPropertyEnumeratedValue() : Object("IfcPropertyEnumeratedValue") {}